

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_forget(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  char *txt;
  AFFECT_DATA af;
  AFFECT_DATA local_90;
  
  bVar1 = is_affected((CHAR_DATA *)vo,sn);
  if (bVar1) {
    if ((CHAR_DATA *)vo == ch) {
      txt = "You are already as senile as you can get.\n\r";
    }
    else {
      txt = "They are already affected by a forget spell.\n\r";
    }
  }
  else {
    bVar1 = saves_spell(level + -5,(CHAR_DATA *)vo,0x10);
    if (!bVar1) {
      init_affect(&local_90);
      local_90.where = 0;
      local_90.aftype = 0;
      local_90.duration =
           (short)(uint)((ulong)((long)level * 0x66666667) >> 0x22) - (short)(level >> 0x1f);
      local_90.location = 0;
      local_90.modifier = 0;
      local_90.level = (short)level;
      local_90.mod_name = 7;
      local_90.owner = ch;
      local_90.type = (short)sn;
      affect_to_char((CHAR_DATA *)vo,&local_90);
      send_to_char("You feel your memories slip away.\n\r",(CHAR_DATA *)vo);
      act("$n suddenly looks disoriented.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
      return;
    }
    txt = "Spell failed.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_forget(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	CHAR_DATA *victim = (CHAR_DATA *)vo;

	if (is_affected(victim, sn))
	{
		if (victim == ch)
			send_to_char("You are already as senile as you can get.\n\r", ch);
		else
			send_to_char("They are already affected by a forget spell.\n\r", ch);

		return;
	}

	if (saves_spell(level - 5, victim, DAM_OTHER))
	{
		send_to_char("Spell failed.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.modifier = 0;
	af.owner = ch;
	af.duration = level / 10;
	af.location = 0;
	af.level = level;
	af.mod_name = MOD_CONC;
	affect_to_char(victim, &af);

	send_to_char("You feel your memories slip away.\n\r", victim);
	act("$n suddenly looks disoriented.", victim, 0, 0, TO_ROOM);
}